

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O1

BOOL __thiscall
Js::JavascriptArray::DirectDeleteItemAt<double>(JavascriptArray *this,uint32 itemIndex)

{
  DynamicObjectFlags DVar1;
  Type TVar2;
  SparseArraySegmentBase *this_00;
  Recycler *recycler;
  uint uVar3;
  
  if (itemIndex < (this->super_ArrayObject).length) {
    this_00 = GetBeginLookupSegment(this,itemIndex,true);
    do {
      if ((this_00 == (SparseArraySegmentBase *)0x0) || (itemIndex < this_00->left)) break;
      uVar3 = this_00->left + this_00->length;
      if (itemIndex < uVar3) {
        recycler = RecyclableObject::GetRecycler((RecyclableObject *)this);
        SparseArraySegment<double>::SetElement
                  ((SparseArraySegment<double> *)this_00,recycler,itemIndex,-NAN);
        TVar2 = this_00->length - 1;
        if (itemIndex - this_00->left == TVar2) {
          this_00->length = TVar2;
          SparseArraySegmentBase::CheckLengthvsSize(this_00);
        }
        else if (this_00 == (this->head).ptr) {
          DVar1 = DynamicObject::GetArrayFlags((DynamicObject *)this);
          DynamicObject::SetArrayFlags((DynamicObject *)this,DVar1 & ~HasNoMissingValues);
        }
      }
      else {
        this_00 = (this_00->next).ptr;
      }
    } while (uVar3 <= itemIndex);
    (*(this->super_ArrayObject).super_DynamicObject.super_RecyclableObject.super_FinalizableObject.
      super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x74])(this);
  }
  return 1;
}

Assistant:

BOOL JavascriptArray::DirectDeleteItemAt(uint32 itemIndex)
    {
        if (itemIndex >= length)
        {
            return true;
        }
        SparseArraySegment<T>* next = (SparseArraySegment<T>*)GetBeginLookupSegment(itemIndex);
        while(next != nullptr && next->left <= itemIndex)
        {
            uint32 limit = next->left + next->length;
            if (itemIndex < limit)
            {
                next->SetElement(GetRecycler(), itemIndex, SparseArraySegment<T>::GetMissingItem());
                if(itemIndex - next->left == next->length - 1)
                {
                    --next->length;
                    next->CheckLengthvsSize();
                }
                else if(next == head)
                {
                    SetHasNoMissingValues(false);
                }
                break;
            }
            next = SparseArraySegment<T>::From(next->next);
        }
#ifdef VALIDATE_ARRAY
        ValidateArray();
#endif
        return true;
    }